

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getvariable.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::GetVariableBind
          (duckdb *this,ClientContext *context,ScalarFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  int iVar1;
  reference pvVar2;
  pointer pEVar3;
  type expr;
  ClientConfig *pCVar4;
  iterator iVar5;
  undefined8 *puVar6;
  ParameterNotResolvedException *this_00;
  NotImplementedException *this_01;
  Value variable_name;
  Value value;
  Value local_108;
  LogicalType local_c8;
  Value local_b0;
  Value local_70;
  
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[6])(pEVar3);
  if ((char)iVar1 == '\0') {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    if ((pEVar3->return_type).id_ != UNKNOWN) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
      if ((char)iVar1 != '\0') {
        LogicalType::LogicalType(&local_c8,SQLNULL);
        Value::Value(&local_70,&local_c8);
        LogicalType::~LogicalType(&local_c8);
        pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar2);
        ExpressionExecutor::EvaluateScalar(&local_b0,context,expr,false);
        if (local_b0.is_null == false) {
          pCVar4 = ClientConfig::GetConfig(context);
          Value::ToString_abi_cxx11_((string *)&local_108,&local_b0);
          iVar5 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(pCVar4->user_variables)._M_h,(key_type *)&local_108);
          if (iVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
              ._M_cur != (__node_type *)0x0) {
            Value::operator=(&local_70,
                             (Value *)((long)iVar5.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                             ._M_cur + 0x28));
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_108.type_._0_8_ !=
              (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_108 + 0x10U)) {
            operator_delete((void *)local_108.type_._0_8_);
          }
        }
        if ((Value *)&(function->super_BaseScalarFunction).return_type != &local_70) {
          (function->super_BaseScalarFunction).return_type.id_ = local_70.type_.id_;
          (function->super_BaseScalarFunction).return_type.physical_type_ =
               local_70.type_.physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(function->super_BaseScalarFunction).return_type.type_info_,
                     &local_70.type_.type_info_);
        }
        puVar6 = (undefined8 *)operator_new(0x48);
        Value::Value(&local_108,&local_70);
        *puVar6 = &PTR__GetVariableBindData_02458e98;
        Value::Value((Value *)(puVar6 + 1),&local_108);
        Value::~Value(&local_108);
        *(undefined8 **)this = puVar6;
        Value::~Value(&local_b0);
        Value::~Value(&local_70);
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
      }
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_108.type_._0_8_ = (long)&local_108 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"getvariable requires a constant input","");
      NotImplementedException::NotImplementedException(this_01,(string *)&local_108);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException(this_00);
  __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> GetVariableBind(ClientContext &context, ScalarFunction &function,
                                                vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->HasParameter() || arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[0]->IsFoldable()) {
		throw NotImplementedException("getvariable requires a constant input");
	}
	Value value;
	auto variable_name = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	if (!variable_name.IsNull()) {
		ClientConfig::GetConfig(context).GetUserVariable(variable_name.ToString(), value);
	}
	function.return_type = value.type();
	return make_uniq<GetVariableBindData>(std::move(value));
}